

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3SegReaderSort(Fts3SegReader **apSegment,int nSegment,int nSuspect,
                      _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp)

{
  undefined8 uVar1;
  int iVar2;
  code *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  Fts3SegReader *pTmp;
  int j;
  int i;
  int local_20;
  int local_1c;
  
  if (in_EDX == in_ESI) {
    in_EDX = in_EDX + -1;
  }
  while (local_1c = in_EDX + -1, -1 < local_1c) {
    local_20 = local_1c;
    while ((in_EDX = local_1c, local_20 < in_ESI + -1 &&
           (iVar2 = (*in_RCX)(*(undefined8 *)(in_RDI + (long)local_20 * 8),
                              *(undefined8 *)(in_RDI + (long)(local_20 + 1) * 8)), -1 < iVar2))) {
      uVar1 = *(undefined8 *)(in_RDI + (long)(local_20 + 1) * 8);
      *(undefined8 *)(in_RDI + (long)(local_20 + 1) * 8) =
           *(undefined8 *)(in_RDI + (long)local_20 * 8);
      *(undefined8 *)(in_RDI + (long)local_20 * 8) = uVar1;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

static void fts3SegReaderSort(
  Fts3SegReader **apSegment,                     /* Array to sort entries of */
  int nSegment,                                  /* Size of apSegment array */
  int nSuspect,                                  /* Unsorted entry count */
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *)  /* Comparison function */
){
  int i;                          /* Iterator variable */

  assert( nSuspect<=nSegment );

  if( nSuspect==nSegment ) nSuspect--;
  for(i=nSuspect-1; i>=0; i--){
    int j;
    for(j=i; j<(nSegment-1); j++){
      Fts3SegReader *pTmp;
      if( xCmp(apSegment[j], apSegment[j+1])<0 ) break;
      pTmp = apSegment[j+1];
      apSegment[j+1] = apSegment[j];
      apSegment[j] = pTmp;
    }
  }

#ifndef NDEBUG
  /* Check that the list really is sorted now. */
  for(i=0; i<(nSuspect-1); i++){
    assert( xCmp(apSegment[i], apSegment[i+1])<0 );
  }
#endif
}